

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PerformImplementation.hpp
# Opt level: O0

void InstructionSet::M68k::Primitive::sbcd
               (uint8_t rhs,uint8_t lhs,uint8_t *destination,Status *status)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  FlagT FVar4;
  int low_adjustment;
  int result;
  int top;
  int unadjusted_result;
  int extend;
  Status *status_local;
  uint8_t *destination_local;
  uint8_t lhs_local;
  uint8_t rhs_local;
  
  uVar3 = (uint)(status->extend_flag != 0);
  uVar1 = ((uint)lhs - (uint)rhs) - uVar3;
  iVar2 = ((lhs & 0xf) - (rhs & 0xf)) - uVar3;
  uVar3 = iVar2 >> 4 & 6;
  FVar4 = (FlagT)(int)(uVar1 - uVar3 & 0x300);
  status->carry_flag = FVar4;
  status->extend_flag = FVar4;
  uVar3 = (iVar2 + (((lhs & 0xf0) - (rhs & 0xf0)) - ((int)uVar1 >> 4 & 0x60U))) - uVar3;
  *destination = (uint8_t)uVar3;
  status->zero_result = (ulong)*destination | status->zero_result;
  Status::set_negative<unsigned_char>(status,*destination);
  status->overflow_flag = (long)(int)(uVar1 & (uVar3 ^ 0xffffffff) & 0x80);
  return;
}

Assistant:

inline void sbcd(uint8_t rhs, uint8_t lhs, uint8_t &destination, Status &status) {
	const int extend = (status.extend_flag ? 1 : 0);
	const int unadjusted_result = lhs - rhs - extend;

	const int top = (lhs & 0xf0) - (rhs & 0xf0) - (0x60 & (unadjusted_result >> 4));

	int result = (lhs & 0xf) - (rhs & 0xf) - extend;
	const int low_adjustment = 0x06 & (result >> 4);
	status.extend_flag = status.carry_flag = Status::FlagT(
		(unadjusted_result - low_adjustment) & 0x300
	);
	result = result + top - low_adjustment;

	/* Store the result. */
	destination = uint8_t(result);

	/* Set all remaining flags essentially as if this were normal subtraction. */
	status.zero_result |= destination;
	status.set_negative(destination);
	status.overflow_flag = unadjusted_result & ~result & 0x80;
}